

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

int key_to_epki_der_priv_bio
              (BIO *out,void *key,int key_nid,char *pemname,key_to_paramstring_fn *p2s,
              i2d_of_void *k2d,key2any_ctx_st *ctx)

{
  int iVar1;
  X509_SIG *p8_00;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  BIO *in_RDI;
  code *in_R8;
  undefined8 in_R9;
  X509_SIG *p8;
  long in_stack_00000008;
  int strtype;
  void *str;
  int ret;
  undefined4 local_4c;
  key2any_ctx_st *ctx_00;
  undefined4 in_stack_ffffffffffffffc0;
  int params_type;
  int key_nid_00;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  key_nid_00 = (int)((ulong)in_RCX >> 0x20);
  params_type = (int)((ulong)in_R9 >> 0x20);
  local_4 = 0;
  ctx_00 = (key2any_ctx_st *)0x0;
  local_4c = 0xffffffff;
  if (*(int *)(in_stack_00000008 + 0xc) == 0) {
    local_4 = 0;
  }
  else {
    if ((in_R8 != (code *)0x0) &&
       (iVar1 = (*in_R8)(in_RSI,in_EDX,*(undefined4 *)(in_stack_00000008 + 8),
                         &stack0xffffffffffffffb8,&local_4c), iVar1 == 0)) {
      return 0;
    }
    p8_00 = (X509_SIG *)
            key_to_encp8((void *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),key_nid_00,in_R8,
                         params_type,(i2d_of_void *)CONCAT44(local_4,in_stack_ffffffffffffffc0),
                         ctx_00);
    if (p8_00 != (X509_SIG *)0x0) {
      local_4 = i2d_PKCS8_bio(in_RDI,p8_00);
    }
    X509_SIG_free(p8_00);
  }
  return local_4;
}

Assistant:

static int key_to_epki_der_priv_bio(BIO *out, const void *key,
                                    int key_nid,
                                    ossl_unused const char *pemname,
                                    key_to_paramstring_fn *p2s,
                                    i2d_of_void *k2d,
                                    struct key2any_ctx_st *ctx)
{
    int ret = 0;
    void *str = NULL;
    int strtype = V_ASN1_UNDEF;
    X509_SIG *p8;

    if (!ctx->cipher_intent)
        return 0;

    if (p2s != NULL && !p2s(key, key_nid, ctx->save_parameters,
                            &str, &strtype))
        return 0;

    p8 = key_to_encp8(key, key_nid, str, strtype, k2d, ctx);
    if (p8 != NULL)
        ret = i2d_PKCS8_bio(out, p8);

    X509_SIG_free(p8);

    return ret;
}